

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DebugInfoManager::ClearDebugScopeAndInlinedAtUses
          (DebugInfoManager *this,Instruction *inst)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_58;
  uint32_t local_4c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_48;
  iterator inlinedat_id_to_users_itr;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_30;
  uint32_t local_24;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_20;
  iterator scope_id_to_users_itr;
  Instruction *inst_local;
  DebugInfoManager *this_local;
  
  scope_id_to_users_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
               )inst;
  local_24 = opt::Instruction::result_id(inst);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::find(&this->scope_id_to_users_,&local_24);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::end(&this->scope_id_to_users_);
  bVar1 = std::__detail::operator!=(&local_20,&local_30);
  if (bVar1) {
    inlinedat_id_to_users_itr =
         std::
         unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
         ::erase(&this->scope_id_to_users_,(iterator)local_20._M_cur);
  }
  local_4c = opt::Instruction::result_id
                       ((Instruction *)
                        scope_id_to_users_itr.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                        ._M_cur);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::find(&this->inlinedat_id_to_users_,&local_4c);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::end(&this->inlinedat_id_to_users_);
  bVar1 = std::__detail::operator!=(&local_48,&local_58);
  if (bVar1) {
    std::
    unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
    ::erase(&this->inlinedat_id_to_users_,(iterator)local_48._M_cur);
  }
  return;
}

Assistant:

void DebugInfoManager::ClearDebugScopeAndInlinedAtUses(Instruction* inst) {
  auto scope_id_to_users_itr = scope_id_to_users_.find(inst->result_id());
  if (scope_id_to_users_itr != scope_id_to_users_.end()) {
    scope_id_to_users_.erase(scope_id_to_users_itr);
  }
  auto inlinedat_id_to_users_itr =
      inlinedat_id_to_users_.find(inst->result_id());
  if (inlinedat_id_to_users_itr != inlinedat_id_to_users_.end()) {
    inlinedat_id_to_users_.erase(inlinedat_id_to_users_itr);
  }
}